

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

void stbir__resample_horizontal_upsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  stbir__contributors *psVar7;
  float *pfVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  ulong uVar16;
  float *pfVar17;
  float *pfVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  
  uVar2 = stbir_info->channels;
  lVar11 = (long)(int)uVar2;
  pfVar6 = stbir_info->decode_buffer;
  lVar14 = (long)(int)(stbir_info->horizontal_filter_pixel_margin * uVar2);
  psVar7 = stbir_info->horizontal_contributors;
  pfVar8 = stbir_info->horizontal_coefficients;
  iVar3 = stbir_info->horizontal_coefficient_width;
  uVar21 = 0;
  uVar20 = 0;
  if (0 < (int)uVar2) {
    uVar20 = (ulong)uVar2;
  }
  uVar16 = (ulong)(uint)stbir_info->output_w;
  if (stbir_info->output_w < 1) {
    uVar16 = uVar21;
  }
  pfVar15 = output_buffer;
  pfVar17 = pfVar8;
  while( true ) {
    if (uVar21 == uVar16) {
      return;
    }
    iVar4 = psVar7[uVar21].n0;
    lVar13 = (long)iVar4;
    iVar5 = psVar7[uVar21].n1;
    lVar12 = (long)iVar5;
    if (iVar5 < iVar4) {
      __assert_fail("n1 >= n0",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                    ,0x5b5,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    iVar9 = stbir_info->horizontal_filter_pixel_margin;
    if (SBORROW4(iVar4,-iVar9) != iVar4 + iVar9 < 0) {
      __assert_fail("n0 >= -stbir_info->horizontal_filter_pixel_margin",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                    ,0x5b6,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    iVar9 = iVar9 + stbir_info->input_w;
    if (iVar9 <= iVar4) break;
    if (iVar9 <= iVar5) {
      __assert_fail("n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                    ,0x5b9,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    if (uVar2 - 1 < 4) {
      lVar19 = uVar21 * lVar11;
      switch(uVar2) {
      case 1:
        for (lVar23 = 0; lVar23 + lVar13 <= lVar12; lVar23 = lVar23 + 1) {
          fVar1 = pfVar17[lVar23];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                          ,0x5c1,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          output_buffer[lVar19] = fVar1 * pfVar6[lVar14 + lVar13 + lVar23] + output_buffer[lVar19];
        }
        break;
      case 2:
        for (lVar23 = 0; lVar23 + lVar13 <= lVar12; lVar23 = lVar23 + 1) {
          fVar1 = pfVar17[lVar23];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                          ,0x5ca,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          output_buffer[lVar19] =
               pfVar6[lVar14 + lVar13 * 2 + lVar23 * 2] * fVar1 + output_buffer[lVar19];
          output_buffer[lVar19 + 1] =
               fVar1 * pfVar6[lVar14 + lVar13 * 2 + lVar23 * 2 + 1] + output_buffer[lVar19 + 1];
        }
        break;
      case 3:
        pfVar18 = pfVar6 + lVar14 + lVar13 * 3 + 2;
        for (lVar23 = 0; lVar23 + lVar13 <= lVar12; lVar23 = lVar23 + 1) {
          fVar1 = pfVar17[lVar23];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                          ,0x5d4,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          output_buffer[lVar19] = pfVar18[-2] * fVar1 + output_buffer[lVar19];
          output_buffer[lVar19 + 1] = pfVar18[-1] * fVar1 + output_buffer[lVar19 + 1];
          output_buffer[lVar19 + 2] = fVar1 * *pfVar18 + output_buffer[lVar19 + 2];
          pfVar18 = pfVar18 + 3;
        }
        break;
      case 4:
        lVar22 = 0;
        for (lVar23 = lVar13; lVar23 <= lVar12; lVar23 = lVar23 + 1) {
          fVar1 = *(float *)((long)pfVar17 + lVar22);
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                          ,0x5df,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          output_buffer[lVar19] =
               pfVar6[lVar14 + lVar13 * 4 + lVar22] * fVar1 + output_buffer[lVar19];
          output_buffer[lVar19 + 1] =
               pfVar6[lVar14 + lVar13 * 4 + lVar22 + 1] * fVar1 + output_buffer[lVar19 + 1];
          output_buffer[lVar19 + 2] =
               pfVar6[lVar14 + lVar13 * 4 + lVar22 + 2] * fVar1 + output_buffer[lVar19 + 2];
          output_buffer[lVar19 + 3] =
               fVar1 * pfVar6[lVar14 + lVar13 * 4 + lVar22 + 3] + output_buffer[lVar19 + 3];
          lVar22 = lVar22 + 4;
        }
      }
    }
    else {
      lVar19 = (long)pfVar6 + lVar13 * lVar11 * 4 + lVar14 * 4;
      lVar23 = 0;
      for (; lVar13 <= lVar12; lVar13 = lVar13 + 1) {
        fVar1 = pfVar8[uVar21 * (long)iVar3 + lVar23];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x5ec,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
        }
        lVar23 = lVar23 + 1;
        for (uVar10 = 0; uVar20 != uVar10; uVar10 = uVar10 + 1) {
          pfVar15[uVar10] = *(float *)(lVar19 + uVar10 * 4) * fVar1 + pfVar15[uVar10];
        }
        lVar19 = lVar19 + lVar11 * 4;
      }
    }
    uVar21 = uVar21 + 1;
    pfVar17 = pfVar17 + iVar3;
    pfVar15 = pfVar15 + lVar11;
  }
  __assert_fail("n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                ,0x5b8,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
}

Assistant:

static void stbir__resample_horizontal_upsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int output_w = stbir_info->output_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;

    for (x = 0; x < output_w; x++)
    {
        int n0 = horizontal_contributors[x].n0;
        int n1 = horizontal_contributors[x].n1;

        int out_pixel_index = x * channels;
        int coefficient_group = coefficient_width * x;
        int coefficient_counter = 0;

        STBIR_ASSERT(n1 >= n0);
        STBIR_ASSERT(n0 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);

        switch (channels) {
            case 1:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
                break;
            case 2:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
                break;
            case 3:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
                break;
            case 4:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
                break;
            default:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    int c;
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
                break;
        }
    }
}